

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  _Rb_tree_node_base *__k;
  char *pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  undefined8 uVar4;
  bool bVar5;
  ParseArgumentStatus PVar6;
  ostream *poVar7;
  iterator iVar8;
  pointer pOVar9;
  _Base_ptr p_Var10;
  long *plVar11;
  size_type sVar12;
  ulong uVar13;
  ulong *puVar14;
  long lVar15;
  pointer directive;
  char *pcVar16;
  CommandLineInterface *pCVar17;
  ulong uVar18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  int iVar19;
  _Rb_tree_node_base *p_Var20;
  int iVar21;
  bool bVar22;
  string value;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  string local_f8;
  undefined1 local_d8 [32];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined8 local_88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_78;
  CommandLineInterface *local_70;
  ulong local_68;
  _Rb_tree_node_base *local_60;
  _Base_ptr local_58;
  _Base_ptr *local_50 [2];
  _Base_ptr local_40 [2];
  
  pcVar16 = *argv;
  pcVar1 = (char *)(this->executable_name_)._M_string_length;
  strlen(pcVar16);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)pcVar16);
  local_98._M_allocated_capacity = 0;
  local_98._8_8_ = 0;
  local_88 = 0;
  if (1 < argc) {
    uVar18 = 1;
    do {
      std::__cxx11::string::string((string *)local_d8,argv[uVar18],(allocator *)&local_f8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_98._M_local_buf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
      pCVar17 = (CommandLineInterface *)local_d8._0_8_;
      if ((CommandLineInterface *)local_d8._0_8_ != (CommandLineInterface *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
      }
      uVar18 = uVar18 + 1;
    } while ((uint)argc != uVar18);
    if (local_98._8_8_ != local_98._M_allocated_capacity) {
      uVar13 = 0;
      iVar21 = 0;
      do {
        local_d8._0_8_ = local_d8 + 0x10;
        local_d8._8_8_ = (_Base_ptr)0x0;
        local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_allocated_capacity =
             local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        bVar5 = ParseArgument(pCVar17,*(char **)(local_98._M_allocated_capacity + uVar13 * 0x20),
                              (string *)local_d8,&local_f8);
        if (bVar5) {
          iVar19 = iVar21 + 1;
          if (((long)(local_98._8_8_ - local_98._0_8_) >> 5 != (long)iVar19) &&
             (**(char **)(local_98._M_allocated_capacity + (long)iVar19 * 0x20) != '-')) {
            std::__cxx11::string::_M_assign((string *)&local_f8);
            iVar21 = iVar19;
            goto LAB_0020485c;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Missing value for flag: ",0x18);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)local_d8._0_8_,local_d8._8_8_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar19 = std::__cxx11::string::compare((char *)local_d8);
          uVar18 = 2;
          if (iVar19 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"To decode an unknown message, use --decode_raw.",0x2f)
            ;
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
            std::ostream::put(-0x50);
            std::ostream::flush();
          }
          bVar5 = false;
        }
        else {
LAB_0020485c:
          PVar6 = InterpretArgument(this,(string *)local_d8,&local_f8);
          bVar5 = PVar6 == PARSE_ARGUMENT_DONE_AND_CONTINUE;
          uVar18 = uVar18 & 0xffffffff;
          if (!bVar5) {
            uVar18 = (ulong)PVar6;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        pCVar17 = (CommandLineInterface *)local_d8._0_8_;
        if ((CommandLineInterface *)local_d8._0_8_ != (CommandLineInterface *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
        PVar6 = (ParseArgumentStatus)uVar18;
        if (!bVar5) goto LAB_00204d6d;
        iVar21 = iVar21 + 1;
        uVar13 = (ulong)iVar21;
      } while (uVar13 < (ulong)((long)(local_98._8_8_ - local_98._0_8_) >> 5));
    }
  }
  p_Var10 = (this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var20 = &(this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var10 != p_Var20) {
    this_00 = &this->plugins_;
    local_58 = &(this->plugins_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_78 = this_00;
    local_70 = this;
    uVar18 = 0;
    local_60 = p_Var20;
    do {
      while( true ) {
        local_68 = uVar18;
        __k = p_Var10 + 1;
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&this_00->_M_t,(key_type *)__k);
        if (iVar8._M_node == local_58) break;
LAB_00204a2d:
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        uVar18 = local_68;
        if (p_Var10 == p_Var20) {
          PVar6 = PARSE_ARGUMENT_FAIL;
          if ((local_68 & 1) == 0) goto LAB_00204c0e;
          goto LAB_00204d6d;
        }
      }
      directive = (this->output_directives_).
                  super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pOVar9 = (this->output_directives_).
               super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (directive != pOVar9) {
        bVar5 = false;
        do {
          if (directive->generator == (CodeGenerator *)0x0) {
            anon_unknown_0::PluginName
                      ((string *)local_d8,(anon_unknown_0 *)(this->plugin_prefix_)._M_dataplus._M_p,
                       (string *)(this->plugin_prefix_)._M_string_length,&directive->name);
            uVar4 = local_d8._0_8_;
            if ((_Base_ptr)local_d8._8_8_ == p_Var10[1]._M_parent) {
              if ((_Base_ptr)local_d8._8_8_ == (_Base_ptr)0x0) {
                bVar22 = true;
                bVar5 = true;
              }
              else {
                iVar21 = bcmp((void *)local_d8._0_8_,*(void **)__k,local_d8._8_8_);
                bVar22 = iVar21 == 0;
                bVar5 = (bool)(bVar5 | bVar22);
              }
            }
            else {
              bVar22 = false;
            }
            if ((CommandLineInterface *)uVar4 != (CommandLineInterface *)(local_d8 + 0x10)) {
              operator_delete((void *)uVar4,(ulong)(local_d8._16_8_ + 1));
            }
            this = local_70;
            if (bVar22) break;
            pOVar9 = (local_70->output_directives_).
                     super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          directive = directive + 1;
        } while (directive != pOVar9);
        this_00 = local_78;
        p_Var20 = local_60;
        if (bVar5) goto LAB_00204a2d;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Unknown flag: ",0xe)
      ;
      std::__cxx11::string::substr((ulong)local_50,(ulong)__k);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x34d97c);
      puVar14 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_f8.field_2._M_allocated_capacity = *puVar14;
        local_f8.field_2._8_8_ = plVar11[3];
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *puVar14;
        local_f8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_f8._M_string_length = plVar11[1];
      *plVar11 = (long)puVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f8);
      pCVar17 = (CommandLineInterface *)(plVar11 + 2);
      if ((CommandLineInterface *)*plVar11 == pCVar17) {
        local_d8._16_8_ = (pCVar17->executable_name_)._M_dataplus._M_p;
        local_d8._24_8_ = plVar11[3];
        local_d8._0_8_ = (CommandLineInterface *)(local_d8 + 0x10);
      }
      else {
        local_d8._16_8_ = (pCVar17->executable_name_)._M_dataplus._M_p;
        local_d8._0_8_ = (CommandLineInterface *)*plVar11;
      }
      local_d8._8_8_ = plVar11[1];
      *plVar11 = (long)pCVar17;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_d8._0_8_,local_d8._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((CommandLineInterface *)local_d8._0_8_ != (CommandLineInterface *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      this_00 = local_78;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],(ulong)((long)&local_40[0]->_M_color + 1));
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      PVar6 = PARSE_ARGUMENT_FAIL;
      uVar18 = CONCAT71((int7)((ulong)p_Var10 >> 8),1);
    } while (p_Var10 != p_Var20);
    goto LAB_00204d6d;
  }
LAB_00204c0e:
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d8,(char (*) [1])0x352e3b,(char (*) [2])0x35b5d3);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->proto_path_,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    if ((CommandLineInterface *)local_d8._0_8_ != (CommandLineInterface *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
    }
  }
  if (this->mode_ == MODE_DECODE) {
    pbVar2 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->codec_type_)._M_string_length == 0) {
      if (pbVar2 != pbVar3) {
        lVar15 = 0x38;
        pcVar16 = "When using --decode_raw, no input files should be given.";
        goto LAB_00204d2d;
      }
    }
    else if (pbVar2 == pbVar3) goto LAB_00204cf2;
LAB_00204d13:
    if ((this->dependency_out_name_)._M_string_length == 0) {
LAB_00204dd1:
      sVar12 = (this->descriptor_set_name_)._M_string_length;
      if ((sVar12 == 0 & this->imports_in_descriptor_set_) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "--include_imports only makes sense when combined with --descriptor_set_out.",
                   0x4b);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        sVar12 = (this->descriptor_set_name_)._M_string_length;
      }
      PVar6 = PARSE_ARGUMENT_DONE_AND_CONTINUE;
      if ((this->source_info_in_descriptor_set_ == true) && (sVar12 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "--include_source_info only makes sense when combined with --descriptor_set_out."
                   ,0x4f);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        PVar6 = PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      goto LAB_00204d6d;
    }
    lVar15 = 0x38;
    pcVar16 = "Can only use --dependency_out=FILE when generating code.";
  }
  else {
    pbVar2 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar2 != pbVar3) {
      if (this->mode_ != MODE_COMPILE) goto LAB_00204d13;
      if (((this->output_directives_).
           super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (this->output_directives_).
           super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         ((this->descriptor_set_name_)._M_string_length == 0)) {
        lVar15 = 0x1a;
        pcVar16 = "Missing output directives.";
      }
      else {
        if ((ulong)((long)pbVar3 - (long)pbVar2) < 0x21 ||
            (this->dependency_out_name_)._M_string_length == 0) goto LAB_00204dd1;
        lVar15 = 0x41;
        pcVar16 = "Can only process one input file when using --dependency_out=FILE.";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar16,lVar15);
      PVar6 = PARSE_ARGUMENT_FAIL;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      goto LAB_00204d6d;
    }
LAB_00204cf2:
    lVar15 = 0x13;
    pcVar16 = "Missing input file.";
  }
LAB_00204d2d:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar16,lVar15);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  PVar6 = PARSE_ARGUMENT_FAIL;
LAB_00204d6d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_98);
  return PVar6;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::ParseArguments(int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  std::vector<string> arguments;
  for (int i = 1; i < argc; ++i) {
    arguments.push_back(argv[i]);
  }

  // Iterate through all arguments and parse them.
  for (int i = 0; i < arguments.size(); ++i) {
    string name, value;

    if (ParseArgument(arguments[i].c_str(), &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == arguments.size() || arguments[i + 1][0] == '-') {
        std::cerr << "Missing value for flag: " << name << std::endl;
        if (name == "--decode") {
          std::cerr << "To decode an unknown message, use --decode_raw."
                    << std::endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = arguments[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE)
      return status;
  }

  // Make sure each plugin option has a matching plugin output.
  bool foundUnknownPluginOption = false;
  for (std::map<string, string>::const_iterator i = plugin_parameters_.begin();
       i != plugin_parameters_.end(); ++i) {
    if (plugins_.find(i->first) != plugins_.end()) {
      continue;
    }
    bool foundImplicitPlugin = false;
    for (std::vector<OutputDirective>::const_iterator j = output_directives_.begin();
         j != output_directives_.end(); ++j) {
      if (j->generator == NULL) {
        string plugin_name = PluginName(plugin_prefix_ , j->name);
        if (plugin_name == i->first) {
          foundImplicitPlugin = true;
          break;
        }
      }
    }
    if (!foundImplicitPlugin) {
      std::cerr << "Unknown flag: "
                // strip prefix + "gen-" and add back "_opt"
                << "--" + i->first.substr(plugin_prefix_.size() + 4) + "_opt"
                << std::endl;
      foundUnknownPluginOption = true;
    }
  }
  if (foundUnknownPluginOption) {
    return PARSE_ARGUMENT_FAIL;
  }

  // If no --proto_path was given, use the current working directory.
  if (proto_path_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(std::pair<string, string>("", "."));
  }

  // Check some errror cases.
  bool decoding_raw = (mode_ == MODE_DECODE) && codec_type_.empty();
  if (decoding_raw && !input_files_.empty()) {
    std::cerr << "When using --decode_raw, no input files should be given."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  } else if (!decoding_raw && input_files_.empty()) {
    std::cerr << "Missing input file." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_name_.empty()) {
    std::cerr << "Missing output directives." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_COMPILE && !dependency_out_name_.empty()) {
    std::cerr << "Can only use --dependency_out=FILE when generating code."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (!dependency_out_name_.empty() && input_files_.size() > 1) {
    std::cerr
        << "Can only process one input file when using --dependency_out=FILE."
        << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_name_.empty()) {
    std::cerr << "--include_imports only makes sense when combined with "
                 "--descriptor_set_out." << std::endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_name_.empty()) {
    std::cerr << "--include_source_info only makes sense when combined with "
                 "--descriptor_set_out." << std::endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}